

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandTime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int fClear;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ch"), iVar2 != -1) {
    if (iVar2 != 99) goto LAB_0032e451;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (bVar1) {
    pAbc->TimeTotal = pAbc->TimeCommand + pAbc->TimeTotal;
    pAbc->TimeCommand = 0.0;
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind) {
    pAbc->TimeTotal = pAbc->TimeCommand + pAbc->TimeTotal;
    fprintf((FILE *)pAbc->Out,"elapse: %3.2f seconds, total: %3.2f seconds\n",pAbc->TimeCommand,
            pAbc->TimeTotal);
    pAbc->TimeCommand = 0.0;
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_0032e451:
    fprintf((FILE *)pAbc->Err,"usage: time [-ch]\n");
    fprintf((FILE *)pAbc->Err,"      \t\tprint the runtime since the last call\n");
    fprintf((FILE *)pAbc->Err,"   -c \t\tclears the elapsed time without printing it\n");
    fprintf((FILE *)pAbc->Err,"   -h \t\tprint the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandTime( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;
    int fClear;

    fClear = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fClear ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fClear )
    {
        pAbc->TimeTotal += pAbc->TimeCommand;
        pAbc->TimeCommand = 0.0;
        return 0;
    }

    if ( argc != globalUtilOptind )
    {
        goto usage;
    }


    pAbc->TimeTotal += pAbc->TimeCommand;
    fprintf( pAbc->Out, "elapse: %3.2f seconds, total: %3.2f seconds\n",
        pAbc->TimeCommand, pAbc->TimeTotal );
/*
    {
        FILE * pTable;
        pTable = fopen( "runtimes.txt", "a+" );
        fprintf( pTable, "%4.2f\n", pAbc->TimeCommand );
        fclose( pTable );
    }
*/
    pAbc->TimeCommand = 0.0;
    return 0;

  usage:
    fprintf( pAbc->Err, "usage: time [-ch]\n" );
    fprintf( pAbc->Err, "      \t\tprint the runtime since the last call\n" );
    fprintf( pAbc->Err, "   -c \t\tclears the elapsed time without printing it\n" );
    fprintf( pAbc->Err, "   -h \t\tprint the command usage\n" );
    return 1;
}